

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O3

float get_active_coin_bias(float k,float avg_loss,float g,float c0)

{
  float __x;
  float fVar1;
  double dVar2;
  float fVar3;
  
  dVar2 = log((double)k + 1.0);
  __x = (float)(((dVar2 + 0.0001) * (double)c0) / ((double)k + 0.0001));
  if (__x < 0.0) {
    fVar3 = sqrtf(__x);
  }
  else {
    fVar3 = SQRT(__x);
  }
  if (avg_loss <= 0.0) {
    avg_loss = 0.0;
  }
  if (1.0 <= avg_loss) {
    avg_loss = 1.0;
  }
  fVar1 = avg_loss + g;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = SQRT(avg_loss) + fVar1;
  if (g <= fVar3 * fVar1 + __x) {
    fVar3 = 1.0;
  }
  else {
    fVar3 = fVar1 * fVar1 + g * 4.0;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar3 = (fVar1 + fVar3) / (g + g);
    fVar3 = __x * fVar3 * fVar3;
  }
  return fVar3;
}

Assistant:

float get_active_coin_bias(float k, float avg_loss, float g, float c0)
{
  float b, sb, rs, sl;
  b = (float)(c0 * (log(k + 1.) + 0.0001) / (k + 0.0001));
  sb = sqrt(b);
  avg_loss = min(1.f, max(0.f, avg_loss));  // loss should be in [0,1]

  sl = sqrt(avg_loss) + sqrt(avg_loss + g);
  if (g <= sb * sl + b)
    return 1;
  rs = (sl + sqrt(sl * sl + 4 * g)) / (2 * g);
  return b * rs * rs;
}